

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeArrayPrototype
               (DynamicObject *arrayPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  RecyclableObject *prototype;
  code *pcVar1;
  bool bVar2;
  JavascriptFunction *pJVar3;
  undefined4 *puVar4;
  ThreadConfiguration *pTVar5;
  DynamicTypeHandler *typeHandler_00;
  DynamicType *type;
  DynamicObject *pDVar6;
  Var pvVar7;
  ScriptContext *pSVar8;
  
  DeferredTypeHandlerBase::Convert(typeHandler,arrayPrototype,mode,0x1b,0);
  this = (((arrayPrototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  pSVar8 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (arrayPrototype,0x67,(this->super_JavascriptLibraryBase).arrayConstructor.ptr,6,0,0,0);
  pJVar3 = AddFunctionToLibraryObject
                     (this,arrayPrototype,0x51,(FunctionInfo *)JavascriptArray::EntryInfo::At,1,
                      '\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet
            ((WriteBarrierPtr<Js::JavascriptFunction> *)&this->field_0x7d0,pJVar3);
  pJVar3 = AddFunctionToLibraryObject
                     (this,arrayPrototype,0x127,(FunctionInfo *)JavascriptArray::EntryInfo::Push,1,
                      '\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet
            ((WriteBarrierPtr<Js::JavascriptFunction> *)&this->field_0x798,pJVar3);
  pJVar3 = AddFunctionToLibraryObject
                     (this,arrayPrototype,0x65,(FunctionInfo *)JavascriptArray::EntryInfo::Concat,1,
                      '\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet
            ((WriteBarrierPtr<Js::JavascriptFunction> *)&this->field_0x7d8,pJVar3);
  pJVar3 = AddFunctionToLibraryObject
                     (this,arrayPrototype,0xcc,(FunctionInfo *)JavascriptArray::EntryInfo::Join,1,
                      '\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet
            ((WriteBarrierPtr<Js::JavascriptFunction> *)&this->field_0x7f8,pJVar3);
  pJVar3 = AddFunctionToLibraryObject
                     (this,arrayPrototype,0x120,(FunctionInfo *)JavascriptArray::EntryInfo::Pop,0,
                      '\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet
            ((WriteBarrierPtr<Js::JavascriptFunction> *)&this->field_0x7a0,pJVar3);
  pJVar3 = AddFunctionToLibraryObject
                     (this,arrayPrototype,0x136,(FunctionInfo *)JavascriptArray::EntryInfo::Reverse,
                      0,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet
            ((WriteBarrierPtr<Js::JavascriptFunction> *)&this->field_0x808,pJVar3);
  pJVar3 = AddFunctionToLibraryObject
                     (this,arrayPrototype,0x14e,(FunctionInfo *)JavascriptArray::EntryInfo::Shift,0,
                      '\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet
            ((WriteBarrierPtr<Js::JavascriptFunction> *)&this->field_0x810,pJVar3);
  pJVar3 = AddFunctionToLibraryObject
                     (this,arrayPrototype,0x150,(FunctionInfo *)JavascriptArray::EntryInfo::Slice,2,
                      '\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet
            ((WriteBarrierPtr<Js::JavascriptFunction> *)&this->field_0x818,pJVar3);
  pJVar3 = AddFunctionToLibraryObject
                     (this,arrayPrototype,0x155,(FunctionInfo *)JavascriptArray::EntryInfo::Splice,2
                      ,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet
            ((WriteBarrierPtr<Js::JavascriptFunction> *)&this->field_0x820,pJVar3);
  pJVar3 = (this->arrayPrototypeToLocaleStringFunction).ptr;
  if ((this->arrayPrototypeToStringFunction).ptr == (JavascriptFunction *)0x0) {
    if (pJVar3 != (JavascriptFunction *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                  ,0x80e,
                                  "(library->arrayPrototypeToLocaleStringFunction == nullptr)",
                                  "library->arrayPrototypeToLocaleStringFunction == nullptr");
      if (!bVar2) goto LAB_00a98815;
      *puVar4 = 0;
    }
    pJVar3 = AddFunctionToLibraryObject
                       (this,arrayPrototype,0x172,
                        (FunctionInfo *)JavascriptArray::EntryInfo::ToLocaleString,0,'\x06');
    Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet
              (&this->arrayPrototypeToLocaleStringFunction,pJVar3);
    pJVar3 = AddFunctionToLibraryObject
                       (this,arrayPrototype,0x178,
                        (FunctionInfo *)JavascriptArray::EntryInfo::ToString,0,'\x06');
    Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet
              (&this->arrayPrototypeToStringFunction,pJVar3);
  }
  else {
    if (pJVar3 == (JavascriptFunction *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                  ,0x815,"(library->arrayPrototypeToLocaleStringFunction)",
                                  "library->arrayPrototypeToLocaleStringFunction");
      if (!bVar2) {
LAB_00a98815:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
      pJVar3 = (this->arrayPrototypeToLocaleStringFunction).ptr;
    }
    (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0x172,pJVar3,6,0,0,0);
    (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])
              (arrayPrototype,0x178,(this->arrayPrototypeToStringFunction).ptr,6,0,0,0);
  }
  pJVar3 = AddFunctionToLibraryObject
                     (this,arrayPrototype,0x18a,(FunctionInfo *)JavascriptArray::EntryInfo::Unshift,
                      1,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet
            ((WriteBarrierPtr<Js::JavascriptFunction> *)&this->field_0x828,pJVar3);
  bVar2 = ScriptContext::IsJsBuiltInEnabled(pSVar8);
  if (!bVar2) {
    pJVar3 = AddFunctionToLibraryObject
                       (this,arrayPrototype,0xb9,(FunctionInfo *)JavascriptArray::EntryInfo::IndexOf
                        ,1,'\x06');
    Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet
              ((WriteBarrierPtr<Js::JavascriptFunction> *)&this->field_0x7e0,pJVar3);
    pJVar3 = AddFunctionToLibraryObject
                       (this,arrayPrototype,0xb8,
                        (FunctionInfo *)JavascriptArray::EntryInfo::Includes,1,'\x06');
    Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet
              ((WriteBarrierPtr<Js::JavascriptFunction> *)&this->field_0x7e8,pJVar3);
  }
  AddFunctionToLibraryObject
            (this,arrayPrototype,0x152,(FunctionInfo *)JavascriptArray::EntryInfo::Sort,1,'\x06');
  pJVar3 = AddFunctionToLibraryObject
                     (this,arrayPrototype,0xd0,
                      (FunctionInfo *)JavascriptArray::EntryInfo::LastIndexOf,1,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet
            ((WriteBarrierPtr<Js::JavascriptFunction> *)&this->field_0x800,pJVar3);
  AddFunctionToLibraryObject
            (this,arrayPrototype,0xd5,(FunctionInfo *)JavascriptArray::EntryInfo::Map,1,'\x06');
  AddFunctionToLibraryObject
            (this,arrayPrototype,0x12d,(FunctionInfo *)JavascriptArray::EntryInfo::ReduceRight,1,
             '\x06');
  pTVar5 = (pSVar8->config).threadConfig;
  if (pTVar5->m_ES6String == true) {
    AddFunctionToLibraryObject
              (this,arrayPrototype,0x8b,(FunctionInfo *)JavascriptArray::EntryInfo::Find,1,'\x06');
    AddFunctionToLibraryObject
              (this,arrayPrototype,0x8c,(FunctionInfo *)JavascriptArray::EntryInfo::FindIndex,1,
               '\x06');
    pTVar5 = (pSVar8->config).threadConfig;
  }
  if (pTVar5->m_ESArrayFindFromLast == true) {
    AddFunctionToLibraryObject
              (this,arrayPrototype,0x8d,(FunctionInfo *)JavascriptArray::EntryInfo::FindLast,1,
               '\x06');
    AddFunctionToLibraryObject
              (this,arrayPrototype,0x8e,(FunctionInfo *)JavascriptArray::EntryInfo::FindLastIndex,1,
               '\x06');
  }
  bVar2 = ScriptContext::IsJsBuiltInEnabled(pSVar8);
  if (bVar2) {
    EnsureBuiltInEngineIsReady(Array_prototype,pSVar8);
  }
  else {
    pJVar3 = EnsureArrayPrototypeEntriesFunction(this);
    (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0x7a,pJVar3,6,0,0,0);
    pJVar3 = EnsureArrayPrototypeKeysFunction(this);
    (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0xcf,pJVar3,6,0,0,0);
    pJVar3 = EnsureArrayPrototypeValuesFunction(this);
    (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,399,pJVar3,6,0,0,0);
    (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0x14,pJVar3,6,0,0,0);
    AddFunctionToLibraryObject
              (this,arrayPrototype,0x89,(FunctionInfo *)JavascriptArray::EntryInfo::Filter,1,'\x06')
    ;
    pJVar3 = EnsureArrayPrototypeForEachFunction(this);
    (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0x93,pJVar3,6,0,0,0);
    AddFunctionToLibraryObject
              (this,arrayPrototype,0x151,(FunctionInfo *)JavascriptArray::EntryInfo::Some,1,'\x06');
    AddFunctionToLibraryObject
              (this,arrayPrototype,300,(FunctionInfo *)JavascriptArray::EntryInfo::Reduce,1,'\x06');
    AddFunctionToLibraryObject
              (this,arrayPrototype,0x82,(FunctionInfo *)JavascriptArray::EntryInfo::Every,1,'\x06');
  }
  prototype = (this->super_JavascriptLibraryBase).nullValue.ptr;
  typeHandler_00 = (DynamicTypeHandler *)NullTypeHandler<false>::GetDefaultInstance();
  type = DynamicType::New(pSVar8,TypeIds_Object,prototype,(JavascriptMethod)0x0,typeHandler_00,false
                          ,false);
  pDVar6 = DynamicObject::New(this->recycler,type);
  pvVar7 = JavascriptBoolean::ToVar(1,pSVar8);
  (*(pDVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(pDVar6,0x51,pvVar7,0,0);
  pvVar7 = JavascriptBoolean::ToVar(1,pSVar8);
  (*(pDVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(pDVar6,99,pvVar7,0,0);
  pvVar7 = JavascriptBoolean::ToVar(1,pSVar8);
  (*(pDVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(pDVar6,0x7a,pvVar7,0,0);
  pvVar7 = JavascriptBoolean::ToVar(1,pSVar8);
  (*(pDVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(pDVar6,0x88,pvVar7,0,0);
  pvVar7 = JavascriptBoolean::ToVar(1,pSVar8);
  (*(pDVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(pDVar6,0x8b,pvVar7,0,0);
  pvVar7 = JavascriptBoolean::ToVar(1,pSVar8);
  (*(pDVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(pDVar6,0x8c,pvVar7,0,0);
  pvVar7 = JavascriptBoolean::ToVar(1,pSVar8);
  (*(pDVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(pDVar6,0x86,pvVar7,0,0);
  pvVar7 = JavascriptBoolean::ToVar(1,pSVar8);
  (*(pDVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(pDVar6,0x87,pvVar7,0,0);
  pvVar7 = JavascriptBoolean::ToVar(1,pSVar8);
  (*(pDVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(pDVar6,0xb8,pvVar7,0,0);
  pvVar7 = JavascriptBoolean::ToVar(1,pSVar8);
  (*(pDVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(pDVar6,0xcf,pvVar7,0,0);
  pvVar7 = JavascriptBoolean::ToVar(1,pSVar8);
  (*(pDVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(pDVar6,399,pvVar7,0,0);
  if (((pSVar8->config).threadConfig)->m_ESArrayFindFromLast == true) {
    pvVar7 = JavascriptBoolean::ToVar(1,pSVar8);
    (*(pDVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x17])(pDVar6,0x8d,pvVar7,0,0);
    pvVar7 = JavascriptBoolean::ToVar(1,pSVar8);
    (*(pDVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x17])(pDVar6,0x8e,pvVar7,0,0);
  }
  (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0x1c,pDVar6,2,0,0,0);
  AddFunctionToLibraryObject
            (this,arrayPrototype,0x88,(FunctionInfo *)JavascriptArray::EntryInfo::Fill,1,'\x06');
  pSVar8 = (ScriptContext *)arrayPrototype;
  AddFunctionToLibraryObject
            (this,arrayPrototype,99,(FunctionInfo *)JavascriptArray::EntryInfo::CopyWithin,2,'\x06')
  ;
  CheckRegisteredBuiltIns((Type *)&this->field_0x650,pSVar8);
  DynamicObject::SetHasNoEnumerableProperties(arrayPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeArrayPrototype(DynamicObject* arrayPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(arrayPrototype, mode, 27);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterArray
        // so that the update is in sync with profiler

        ScriptContext* scriptContext = arrayPrototype->GetScriptContext();
        JavascriptLibrary* library = arrayPrototype->GetLibrary();

        library->AddMember(arrayPrototype, PropertyIds::constructor, library->arrayConstructor);

        Field(JavascriptFunction*)* builtinFuncs = library->GetBuiltinFunctions();

        builtinFuncs[BuiltinFunction::JavascriptArray_At]                 = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::at,              &JavascriptArray::EntryInfo::At,                1);
        builtinFuncs[BuiltinFunction::JavascriptArray_Push]               = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::push,            &JavascriptArray::EntryInfo::Push,              1);
        builtinFuncs[BuiltinFunction::JavascriptArray_Concat]             = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::concat,          &JavascriptArray::EntryInfo::Concat,            1);
        builtinFuncs[BuiltinFunction::JavascriptArray_Join]               = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::join,            &JavascriptArray::EntryInfo::Join,              1);
        builtinFuncs[BuiltinFunction::JavascriptArray_Pop]                = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::pop,             &JavascriptArray::EntryInfo::Pop,               0);
        builtinFuncs[BuiltinFunction::JavascriptArray_Reverse]            = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::reverse,         &JavascriptArray::EntryInfo::Reverse,           0);
        builtinFuncs[BuiltinFunction::JavascriptArray_Shift]              = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::shift,           &JavascriptArray::EntryInfo::Shift,             0);
        builtinFuncs[BuiltinFunction::JavascriptArray_Slice]              = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::slice,           &JavascriptArray::EntryInfo::Slice,             2);
        builtinFuncs[BuiltinFunction::JavascriptArray_Splice]             = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::splice,          &JavascriptArray::EntryInfo::Splice,            2);

        // The toString and toLocaleString properties are shared between Array.prototype and %TypedArray%.prototype.
        // Whichever prototype is initialized first will create the functions, the other should just load the existing function objects.
        if (library->arrayPrototypeToStringFunction == nullptr)
        {
            Assert(library->arrayPrototypeToLocaleStringFunction == nullptr);

            library->arrayPrototypeToLocaleStringFunction = /* No inlining       Array_ToLocaleString */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::toLocaleString, &JavascriptArray::EntryInfo::ToLocaleString, 0);
            library->arrayPrototypeToStringFunction =       /* No inlining       Array_ToString       */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::toString, &JavascriptArray::EntryInfo::ToString, 0);
        }
        else
        {
            Assert(library->arrayPrototypeToLocaleStringFunction);

            library->AddMember(arrayPrototype, PropertyIds::toLocaleString, library->arrayPrototypeToLocaleStringFunction);
            library->AddMember(arrayPrototype, PropertyIds::toString, library->arrayPrototypeToStringFunction);
        }

        builtinFuncs[BuiltinFunction::JavascriptArray_Unshift]            = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::unshift,         &JavascriptArray::EntryInfo::Unshift,           1);

        if (!scriptContext->IsJsBuiltInEnabled())
        {
            builtinFuncs[BuiltinFunction::JavascriptArray_IndexOf] = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::indexOf, &JavascriptArray::EntryInfo::IndexOf, 1);
            builtinFuncs[BuiltinFunction::JavascriptArray_Includes] = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::includes, &JavascriptArray::EntryInfo::Includes, 1);
        }

        /* No inlining                Array_Sort               */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::sort, &JavascriptArray::EntryInfo::Sort, 1);

        builtinFuncs[BuiltinFunction::JavascriptArray_LastIndexOf]    = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::lastIndexOf,     &JavascriptArray::EntryInfo::LastIndexOf,       1);
        /* No inlining                Array_Map            */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::map,             &JavascriptArray::EntryInfo::Map,               1);
        /* No inlining                Array_ReduceRight    */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::reduceRight,     &JavascriptArray::EntryInfo::ReduceRight,       1);

        if (scriptContext->GetConfig()->IsES6StringExtensionsEnabled()) // This is not a typo, Array.prototype.find and .findIndex are part of the ES6 Improved String APIs feature
        {
            /* No inlining            Array_Find           */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::find,            &JavascriptArray::EntryInfo::Find,              1);
            /* No inlining            Array_FindIndex      */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::findIndex,       &JavascriptArray::EntryInfo::FindIndex,         1);
        }
        if (scriptContext->GetConfig()->IsESArrayFindFromLastEnabled())
        {
            /* No inlining            Array_FindLast           */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::findLast, &JavascriptArray::EntryInfo::FindLast, 1);
            /* No inlining            Array_FindLastIndex      */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::findLastIndex, &JavascriptArray::EntryInfo::FindLastIndex, 1);
        }

#ifdef ENABLE_JS_BUILTINS
        if (scriptContext->IsJsBuiltInEnabled())
        {
            EnsureBuiltInEngineIsReady(JsBuiltInFile::Array_prototype, scriptContext);
        }
        else
#endif
        {
            /* No inlining                Array_Entries        */
            library->AddMember(arrayPrototype, PropertyIds::entries, library->EnsureArrayPrototypeEntriesFunction());

            /* No inlining                Array_Keys           */
            library->AddMember(arrayPrototype, PropertyIds::keys, library->EnsureArrayPrototypeKeysFunction());

            JavascriptFunction *values = library->EnsureArrayPrototypeValuesFunction();
            /* No inlining                Array_Values         */ library->AddMember(arrayPrototype, PropertyIds::values, values);
            /* No inlining                Array_SymbolIterator */ library->AddMember(arrayPrototype, PropertyIds::_symbolIterator, values);

            /* No inlining                Array_Filter         */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::filter, &JavascriptArray::EntryInfo::Filter, 1);
            /* No inlining                Array_ForEach        */ library->AddMember(arrayPrototype, PropertyIds::forEach, library->EnsureArrayPrototypeForEachFunction());
            /* No inlining                Array_Some           */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::some, &JavascriptArray::EntryInfo::Some, 1);
            /* No inlining                Array_Reduce         */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::reduce, &JavascriptArray::EntryInfo::Reduce, 1);
            /* No inlining                Array_Every          */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::every, &JavascriptArray::EntryInfo::Every, 1);
        }

        DynamicType* dynamicType = DynamicType::New(scriptContext, TypeIds_Object, library->nullValue, nullptr, NullTypeHandler<false>::GetDefaultInstance(), false);
        DynamicObject* unscopablesList = DynamicObject::New(library->GetRecycler(), dynamicType);
        unscopablesList->SetProperty(PropertyIds::at,               JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
        unscopablesList->SetProperty(PropertyIds::copyWithin,       JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
        unscopablesList->SetProperty(PropertyIds::entries,          JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
        unscopablesList->SetProperty(PropertyIds::fill,             JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
        unscopablesList->SetProperty(PropertyIds::find,             JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
        unscopablesList->SetProperty(PropertyIds::findIndex,        JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
        unscopablesList->SetProperty(PropertyIds::flat,             JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
        unscopablesList->SetProperty(PropertyIds::flatMap,          JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
        unscopablesList->SetProperty(PropertyIds::includes,         JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
        unscopablesList->SetProperty(PropertyIds::keys,             JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
        unscopablesList->SetProperty(PropertyIds::values,           JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);

        if (scriptContext->GetConfig()->IsESArrayFindFromLastEnabled())
        {
            unscopablesList->SetProperty(PropertyIds::findLast, JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
            unscopablesList->SetProperty(PropertyIds::findLastIndex, JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
        }

        library->AddMember(arrayPrototype, PropertyIds::_symbolUnscopables, unscopablesList, PropertyConfigurable);

        /* No inlining            Array_Fill           */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::fill, &JavascriptArray::EntryInfo::Fill, 1);
        /* No inlining            Array_CopyWithin     */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::copyWithin, &JavascriptArray::EntryInfo::CopyWithin, 2);
        DebugOnly(CheckRegisteredBuiltIns(builtinFuncs, scriptContext));

        arrayPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }